

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# film_grain_table_test.cc
# Opt level: O1

void __thiscall
FilmGrainEncodeTest_InitMonochrome1EncodeMonochrome0_Test::TestBody
          (FilmGrainEncodeTest_InitMonochrome1EncodeMonochrome0_Test *this)

{
  uchar *puVar1;
  undefined8 uVar2;
  aom_codec_err_t aVar3;
  aom_codec_iface_t *iface;
  uchar *img_data;
  value_type_conflict3 *__val;
  long *plVar4;
  SEARCH_METHODS *pSVar5;
  AssertionResult gtest_ar_5;
  aom_codec_err_t init_status;
  aom_codec_ctx_t enc;
  aom_image_t img;
  aom_codec_enc_cfg_t cfg;
  _Head_base<0UL,_std::__cxx11::basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
  local_4a0;
  AssertHelper local_498;
  uchar *local_490;
  AssertHelper local_488;
  aom_codec_err_t local_47c;
  aom_codec_ctx_t local_478;
  undefined1 local_440 [168];
  aom_codec_enc_cfg_t local_398;
  
  iface = aom_codec_av1_cx();
  local_478.name._0_4_ = aom_codec_enc_config_default(iface,&local_398,1);
  local_498.data_._0_4_ = AOM_CODEC_OK;
  testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
            ((internal *)local_440,"aom_codec_enc_config_default(iface, &cfg, usage)","AOM_CODEC_OK"
             ,(aom_codec_err_t *)&local_478,(aom_codec_err_t *)&local_498);
  uVar2 = local_440._8_8_;
  if (local_440[0] == (internal)0x0) {
    testing::Message::Message((Message *)&local_478);
    if ((uchar *)local_440._8_8_ == (uchar *)0x0) {
      pSVar5 = "";
    }
    else {
      pSVar5 = *(SEARCH_METHODS **)local_440._8_8_;
    }
    testing::internal::AssertHelper::AssertHelper
              (&local_498,kFatalFailure,
               "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
               ,0x167,(char *)pSVar5);
    testing::internal::AssertHelper::operator=(&local_498,(Message *)&local_478);
    testing::internal::AssertHelper::~AssertHelper(&local_498);
    plVar4 = (long *)CONCAT44(local_478.name._4_4_,(aom_codec_err_t)local_478.name);
LAB_004ecd6b:
    if (plVar4 != (long *)0x0) {
      (**(code **)(*plVar4 + 8))();
    }
    if ((uchar *)local_440._8_8_ == (uchar *)0x0) {
      return;
    }
    local_490 = *(uchar **)local_440._8_8_;
    img_data = (uchar *)local_440._8_8_;
    if (local_490 == (uchar *)(local_440._8_8_ + 0x10)) goto LAB_004ecd91;
  }
  else {
    if ((uchar *)local_440._8_8_ != (uchar *)0x0) {
      if (*(uchar **)local_440._8_8_ != (uchar *)(local_440._8_8_ + 0x10)) {
        operator_delete(*(uchar **)local_440._8_8_);
      }
      operator_delete((void *)uVar2);
    }
    local_398.g_w = 0x160;
    local_398.g_h = 0x120;
    local_398.monochrome = 1;
    local_47c = aom_codec_enc_init_ver(&local_478,iface,&local_398,0,0x1d);
    local_498.data_._0_4_ = AOM_CODEC_OK;
    testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
              ((internal *)local_440,"init_status","AOM_CODEC_OK",&local_47c,
               (aom_codec_err_t *)&local_498);
    uVar2 = local_440._8_8_;
    if (local_440[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_498);
      if ((uchar *)local_440._8_8_ == (uchar *)0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)local_440._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_4a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
                 ,0x16e,(char *)pSVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_4a0,(Message *)&local_498);
LAB_004ecd5c:
      testing::internal::AssertHelper::~AssertHelper((AssertHelper *)&local_4a0);
      plVar4 = (long *)CONCAT44(local_498.data_._4_4_,(aom_codec_err_t)local_498.data_);
      goto LAB_004ecd6b;
    }
    if ((uchar *)local_440._8_8_ != (uchar *)0x0) {
      if (*(uchar **)local_440._8_8_ != (uchar *)(local_440._8_8_ + 0x10)) {
        operator_delete(*(uchar **)local_440._8_8_);
      }
      operator_delete((void *)uVar2);
    }
    local_498.data_._0_4_ = aom_codec_control(&local_478,0xd,7);
    local_4a0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)
         ((ulong)local_4a0._M_head_impl._4_4_ << 0x20);
    testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
              ((internal *)local_440,"aom_codec_control(&enc, AOME_SET_CPUUSED, 7)","AOM_CODEC_OK",
               (aom_codec_err_t *)&local_498,(aom_codec_err_t *)&local_4a0);
    uVar2 = local_440._8_8_;
    if (local_440[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_498);
      if ((uchar *)local_440._8_8_ == (uchar *)0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)local_440._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_4a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
                 ,0x16f,(char *)pSVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_4a0,(Message *)&local_498);
      goto LAB_004ecd5c;
    }
    if ((uchar *)local_440._8_8_ != (uchar *)0x0) {
      if (*(uchar **)local_440._8_8_ != (uchar *)(local_440._8_8_ + 0x10)) {
        operator_delete(*(uchar **)local_440._8_8_);
      }
      operator_delete((void *)uVar2);
    }
    local_498.data_._0_4_ = aom_codec_control(&local_478,0x2b,2);
    local_4a0._M_head_impl = local_4a0._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
              ((internal *)local_440,
               "aom_codec_control(&enc, AV1E_SET_TUNE_CONTENT, AOM_CONTENT_FILM)","AOM_CODEC_OK",
               (aom_codec_err_t *)&local_498,(aom_codec_err_t *)&local_4a0);
    uVar2 = local_440._8_8_;
    if (local_440[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_498);
      if ((uchar *)local_440._8_8_ == (uchar *)0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)local_440._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_4a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
                 ,0x171,(char *)pSVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_4a0,(Message *)&local_498);
      goto LAB_004ecd5c;
    }
    if ((uchar *)local_440._8_8_ != (uchar *)0x0) {
      if (*(uchar **)local_440._8_8_ != (uchar *)(local_440._8_8_ + 0x10)) {
        operator_delete(*(uchar **)local_440._8_8_);
      }
      operator_delete((void *)uVar2);
    }
    local_498.data_._0_4_ = aom_codec_control(&local_478,0x72,1);
    local_4a0._M_head_impl = local_4a0._M_head_impl & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
              ((internal *)local_440,"aom_codec_control(&enc, AV1E_SET_DENOISE_NOISE_LEVEL, 1)",
               "AOM_CODEC_OK",(aom_codec_err_t *)&local_498,(aom_codec_err_t *)&local_4a0);
    if (local_440[0] == (internal)0x0) {
      testing::Message::Message((Message *)&local_498);
      if ((uchar *)local_440._8_8_ == (uchar *)0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)local_440._8_8_;
      }
      testing::internal::AssertHelper::AssertHelper
                ((AssertHelper *)&local_4a0,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
                 ,0x173,(char *)pSVar5);
      testing::internal::AssertHelper::operator=((AssertHelper *)&local_4a0,(Message *)&local_498);
      goto LAB_004ecd5c;
    }
    if ((uchar *)local_440._8_8_ != (uchar *)0x0) {
      if (*(uchar **)local_440._8_8_ != (uchar *)(local_440._8_8_ + 0x10)) {
        operator_delete(*(uchar **)local_440._8_8_);
      }
      operator_delete((void *)local_440._8_8_);
    }
    img_data = (uchar *)operator_new(0x25340);
    memset(img_data,0,0x25340);
    local_4a0._M_head_impl =
         (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)local_440;
    local_488.data_ =
         (AssertHelperData *)
         aom_img_wrap((aom_image_t *)local_440,AOM_IMG_FMT_I420,0x160,0x120,1,img_data);
    testing::internal::CmpHelperEQ<aom_image*,aom_image*>
              ((internal *)&local_498,"&img",
               "aom_img_wrap(&img, AOM_IMG_FMT_I420, kWidth, kHeight, 1, buffer.data())",
               (aom_image **)&local_4a0,(aom_image **)&local_488);
    if (local_498.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_4a0);
      if (local_490 == (uchar *)0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)local_490;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_488,kNonFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
                 ,0x17a,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_488,(Message *)&local_4a0);
      testing::internal::AssertHelper::~AssertHelper(&local_488);
      if ((aom_image_t *)local_4a0._M_head_impl != (aom_image_t *)0x0) {
        (**(code **)(*(long *)local_4a0._M_head_impl + 8))();
      }
    }
    puVar1 = local_490;
    if (local_490 != (uchar *)0x0) {
      if (*(uchar **)local_490 != local_490 + 0x10) {
        operator_delete(*(uchar **)local_490);
      }
      operator_delete(puVar1);
    }
    aVar3 = aom_codec_encode(&local_478,(aom_image_t *)local_440,0,1,0);
    local_4a0._M_head_impl._0_4_ = aVar3;
    local_488.data_ = local_488.data_ & 0xffffffff00000000;
    testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
              ((internal *)&local_498,"aom_codec_encode(&enc, &img, 0, 1, 0)","AOM_CODEC_OK",
               (aom_codec_err_t *)&local_4a0,(aom_codec_err_t *)&local_488);
    puVar1 = local_490;
    if (local_498.data_._0_1_ == (internal)0x0) {
      testing::Message::Message((Message *)&local_4a0);
      if (local_490 == (uchar *)0x0) {
        pSVar5 = "";
      }
      else {
        pSVar5 = *(SEARCH_METHODS **)local_490;
      }
      testing::internal::AssertHelper::AssertHelper
                (&local_488,kFatalFailure,
                 "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
                 ,0x17c,(char *)pSVar5);
      testing::internal::AssertHelper::operator=(&local_488,(Message *)&local_4a0);
LAB_004ed022:
      testing::internal::AssertHelper::~AssertHelper(&local_488);
      if (local_4a0._M_head_impl !=
          (basic_stringstream<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        (**(code **)(*(long *)local_4a0._M_head_impl + 8))();
      }
    }
    else {
      if (local_490 != (uchar *)0x0) {
        if (*(uchar **)local_490 != local_490 + 0x10) {
          operator_delete(*(uchar **)local_490);
        }
        operator_delete(puVar1);
      }
      local_398.monochrome = 0;
      aVar3 = aom_codec_enc_config_set(&local_478,&local_398);
      local_4a0._M_head_impl._0_4_ = aVar3;
      local_488.data_._0_4_ = 8;
      testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                ((internal *)&local_498,"aom_codec_enc_config_set(&enc, &cfg)",
                 "AOM_CODEC_INVALID_PARAM",(aom_codec_err_t *)&local_4a0,
                 (aom_codec_err_t *)&local_488);
      puVar1 = local_490;
      if (local_498.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_4a0);
        if (local_490 == (uchar *)0x0) {
          pSVar5 = "";
        }
        else {
          pSVar5 = *(SEARCH_METHODS **)local_490;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_488,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
                   ,0x17f,(char *)pSVar5);
        testing::internal::AssertHelper::operator=(&local_488,(Message *)&local_4a0);
        goto LAB_004ed022;
      }
      if (local_490 != (uchar *)0x0) {
        if (*(uchar **)local_490 != local_490 + 0x10) {
          operator_delete(*(uchar **)local_490);
        }
        operator_delete(puVar1);
      }
      aVar3 = aom_codec_destroy(&local_478);
      local_4a0._M_head_impl._0_4_ = aVar3;
      local_488.data_ = local_488.data_ & 0xffffffff00000000;
      testing::internal::CmpHelperEQ<aom_codec_err_t,aom_codec_err_t>
                ((internal *)&local_498,"aom_codec_destroy(&enc)","AOM_CODEC_OK",
                 (aom_codec_err_t *)&local_4a0,(aom_codec_err_t *)&local_488);
      if (local_498.data_._0_1_ == (internal)0x0) {
        testing::Message::Message((Message *)&local_4a0);
        if (local_490 == (uchar *)0x0) {
          pSVar5 = "";
        }
        else {
          pSVar5 = *(SEARCH_METHODS **)local_490;
        }
        testing::internal::AssertHelper::AssertHelper
                  (&local_488,kFatalFailure,
                   "/workspace/llm4binary/github/license_all_cmakelists_1510/m-ab-s[P]aom/test/film_grain_table_test.cc"
                   ,0x180,(char *)pSVar5);
        testing::internal::AssertHelper::operator=(&local_488,(Message *)&local_4a0);
        goto LAB_004ed022;
      }
    }
    local_440._8_8_ = img_data;
    if (local_490 == (uchar *)0x0) goto LAB_004ecd91;
    if (*(uchar **)local_490 != local_490 + 0x10) {
      operator_delete(*(uchar **)local_490);
    }
  }
  operator_delete(local_490);
  local_440._8_8_ = img_data;
LAB_004ecd91:
  operator_delete((void *)local_440._8_8_);
  return;
}

Assistant:

TEST(FilmGrainEncodeTest, InitMonochrome1EncodeMonochrome0) {
  const int kWidth = 352;
  const int kHeight = 288;
  const int usage = AOM_USAGE_REALTIME;
  aom_codec_iface_t *iface = aom_codec_av1_cx();
  aom_codec_enc_cfg_t cfg;
  ASSERT_EQ(aom_codec_enc_config_default(iface, &cfg, usage), AOM_CODEC_OK);
  aom_codec_ctx_t enc;
  cfg.g_w = kWidth;
  cfg.g_h = kHeight;
  // Initialize encoder, with monochrome = 0.
  cfg.monochrome = 1;
  aom_codec_err_t init_status = aom_codec_enc_init(&enc, iface, &cfg, 0);
  ASSERT_EQ(init_status, AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AOME_SET_CPUUSED, 7), AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_TUNE_CONTENT, AOM_CONTENT_FILM),
            AOM_CODEC_OK);
  ASSERT_EQ(aom_codec_control(&enc, AV1E_SET_DENOISE_NOISE_LEVEL, 1),
            AOM_CODEC_OK);
  // Set image with zero values.
  constexpr size_t kBufferSize =
      kWidth * kHeight + 2 * (kWidth + 1) / 2 * (kHeight + 1) / 2;
  std::vector<unsigned char> buffer(kBufferSize);
  aom_image_t img;
  EXPECT_EQ(&img, aom_img_wrap(&img, AOM_IMG_FMT_I420, kWidth, kHeight, 1,
                               buffer.data()));
  // Encode first frame.
  ASSERT_EQ(aom_codec_encode(&enc, &img, 0, 1, 0), AOM_CODEC_OK);
  // Second frame: update config with monochrome = 1.
  cfg.monochrome = 0;
  ASSERT_EQ(aom_codec_enc_config_set(&enc, &cfg), AOM_CODEC_INVALID_PARAM);
  ASSERT_EQ(aom_codec_destroy(&enc), AOM_CODEC_OK);
}